

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

amqp_bytes_t sasl_response(amqp_pool_t *pool,amqp_sasl_method_enum method,__va_list_tag *args)

{
  uint uVar1;
  char *__s;
  char *pcVar2;
  amqp_bytes_t aVar3;
  size_t __n;
  undefined8 *amount;
  size_t sVar4;
  amqp_pool_t *in_RDX;
  uint in_ESI;
  size_t identity_len;
  char *identity;
  char *response_buf;
  size_t password_len;
  char *password;
  size_t username_len;
  char *username;
  amqp_bytes_t response;
  size_t in_stack_ffffffffffffff48;
  amqp_pool_t *in_stack_ffffffffffffff50;
  undefined8 *local_90;
  undefined8 *local_78;
  size_t local_10;
  undefined1 *local_8;
  
  if (in_ESI == 0) {
    uVar1 = (uint)in_RDX->pagesize;
    if (uVar1 < 0x29) {
      local_78 = (undefined8 *)((long)(int)uVar1 + (long)(in_RDX->pages).blocklist);
      *(uint *)&in_RDX->pagesize = uVar1 + 8;
    }
    else {
      local_78 = *(undefined8 **)&in_RDX->pages;
      *(undefined8 **)&in_RDX->pages = local_78 + 1;
    }
    pcVar2 = (char *)*local_78;
    sVar4 = strlen(pcVar2);
    uVar1 = (uint)in_RDX->pagesize;
    if (uVar1 < 0x29) {
      local_90 = (undefined8 *)((long)(int)uVar1 + (long)(in_RDX->pages).blocklist);
      *(uint *)&in_RDX->pagesize = uVar1 + 8;
    }
    else {
      local_90 = *(undefined8 **)&in_RDX->pages;
      *(undefined8 **)&in_RDX->pages = local_90 + 1;
    }
    __s = (char *)*local_90;
    __n = strlen(__s);
    strlen(pcVar2);
    strlen(__s);
    amqp_pool_alloc_bytes
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(amqp_bytes_t *)0x114783);
    if (local_8 != (undefined1 *)0x0) {
      *local_8 = 0;
      memcpy(local_8 + 1,pcVar2,sVar4);
      local_8[sVar4 + 1] = 0;
      memcpy(local_8 + sVar4 + 2,__s,__n);
    }
  }
  else {
    if (in_ESI != 1) {
      amqp_abort("Invalid SASL method: %d",(ulong)in_ESI);
    }
    uVar1 = (uint)in_RDX->pagesize;
    if (uVar1 < 0x29) {
      amount = (undefined8 *)((long)(int)uVar1 + (long)(in_RDX->pages).blocklist);
      *(uint *)&in_RDX->pagesize = uVar1 + 8;
    }
    else {
      amount = *(undefined8 **)&in_RDX->pages;
      *(undefined8 **)&in_RDX->pages = amount + 1;
    }
    pcVar2 = (char *)*amount;
    sVar4 = strlen(pcVar2);
    amqp_pool_alloc_bytes(in_RDX,(size_t)amount,(amqp_bytes_t *)0x11487d);
    if (local_8 != (undefined1 *)0x0) {
      memcpy(local_8,pcVar2,sVar4);
    }
  }
  aVar3.bytes = local_8;
  aVar3.len = local_10;
  return aVar3;
}

Assistant:

static amqp_bytes_t sasl_response(amqp_pool_t *pool,
                                  amqp_sasl_method_enum method, va_list args) {
  amqp_bytes_t response;

  switch (method) {
    case AMQP_SASL_METHOD_PLAIN: {
      char *username = va_arg(args, char *);
      size_t username_len = strlen(username);
      char *password = va_arg(args, char *);
      size_t password_len = strlen(password);
      char *response_buf;

      amqp_pool_alloc_bytes(pool, strlen(username) + strlen(password) + 2,
                            &response);
      if (response.bytes == NULL)
      /* We never request a zero-length block, because of the +2
         above, so a NULL here really is ENOMEM. */
      {
        return response;
      }

      response_buf = response.bytes;
      response_buf[0] = 0;
      memcpy(response_buf + 1, username, username_len);
      response_buf[username_len + 1] = 0;
      memcpy(response_buf + username_len + 2, password, password_len);
      break;
    }
    case AMQP_SASL_METHOD_EXTERNAL: {
      char *identity = va_arg(args, char *);
      size_t identity_len = strlen(identity);

      amqp_pool_alloc_bytes(pool, identity_len, &response);
      if (response.bytes == NULL) {
        return response;
      }

      memcpy(response.bytes, identity, identity_len);
      break;
    }
    default:
      amqp_abort("Invalid SASL method: %d", (int)method);
  }

  return response;
}